

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_1.c
# Opt level: O2

void another_function(void)

{
  uint uVar1;
  FILE *__stream;
  ulong uVar2;
  long lVar3;
  stop_t *stops;
  stop_t *local_20;
  
  __stream = fopen("../tests/data/google_sample/stops.txt","r");
  lVar3 = 0;
  uVar1 = 0;
  if (__stream != (FILE *)0x0) {
    uVar1 = read_all_stops((FILE *)__stream,&local_20);
    fclose(__stream);
  }
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar2 = (ulong)uVar1;
  }
  for (; uVar2 * 0x3b0 - lVar3 != 0; lVar3 = lVar3 + 0x3b0) {
    do_stuff_with_stop((stop_t *)(local_20->id + lVar3));
  }
  if (0 < (int)uVar1) {
    free(local_20);
  }
  return;
}

Assistant:

void another_function(void) {
    int stops_count = 0;
    stop_t *stops;

    // It's 100% up to the developer to ensure
    // that the correct file is passed
    // to the parsing functions.
    FILE *fp = fopen("../tests/data/google_sample/stops.txt", "r");
    if (fp) {
        // The function allocates all the required memory.
        stops_count = read_all_stops(fp, &stops);
        fclose(fp);
    }

    for (int i = 0; i < stops_count; i++)
        do_stuff_with_stop(&(stops[i]));

    if (stops_count > 0)
        free(stops);
}